

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_AngleTo(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  int iVar1;
  VMValue *pVVar2;
  bool bVar3;
  bool local_71;
  DObject *local_70;
  bool local_63;
  undefined1 local_60 [16];
  double u;
  DObject *pDStack_48;
  bool absolute;
  AActor *targ;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = (DThinker *)ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e1a,
                  "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e1a,
                  "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  targ = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (targ != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)targ,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e1a,
                  "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e1b,
                  "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar3 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar3 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (bVar3) {
    if (defaultparam_local[(int)self].Array == (VMValue *)0x0) {
      NullParam("\"targ\"");
      local_70 = (DObject *)defaultparam_local[(int)self].Array;
    }
    else {
      local_70 = (DObject *)defaultparam_local[(int)self].Array;
    }
    pDStack_48 = local_70;
    local_71 = true;
    if (local_70 != (DObject *)0x0) {
      local_71 = DObject::IsKindOf(local_70,AActor::RegistrationInfo.MyClass);
    }
    if (local_71 != false) {
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e1c,
                        "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        iVar1 = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e1c,
                        "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        iVar1 = (pVVar2->field_0).i;
      }
      u._7_1_ = iVar1 != 0;
      AActor::AngleTo((AActor *)local_60,targ,SUB81(pDStack_48,0));
      local_60._8_8_ = local_60._0_8_;
      if (self._4_4_ < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (_paramnum == (DThinker *)0x0) {
          __assert_fail("ret != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e1d,
                        "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        VMReturn::SetFloat((VMReturn *)_paramnum,(double)local_60._0_8_);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("targ == NULL || targ->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e1b,
                  "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e1b,"int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, AngleTo)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(targ, AActor);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_FLOAT(self->AngleTo(targ, absolute).Degrees);
}